

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spvIR.h
# Opt level: O3

StorageClass __thiscall spv::Module::getStorageClass(Module *this,Id typeId)

{
  Instruction *pIVar1;
  
  pIVar1 = (this->idToInstruction).
           super__Vector_base<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>._M_impl.
           super__Vector_impl_data._M_start[typeId];
  if (pIVar1->opCode != OpTypePointer) {
    __assert_fail("idToInstruction[typeId]->getOpCode() == spv::OpTypePointer",
                  "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/SPIRV/spvIR.h"
                  ,0x200,"StorageClass spv::Module::getStorageClass(Id) const");
  }
  if ((**(byte **)&(pIVar1->idOperand).super__Bvector_base<std::allocator<bool>_>._M_impl.
                   super__Bvector_impl_data & 1) == 0) {
    return *(pIVar1->operands).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
            _M_impl.super__Vector_impl_data._M_start;
  }
  __assert_fail("!idOperand[op]",
                "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/SPIRV/spvIR.h"
                ,0xa5,"unsigned int spv::Instruction::getImmediateOperand(int) const");
}

Assistant:

StorageClass getStorageClass(Id typeId) const
    {
        assert(idToInstruction[typeId]->getOpCode() == spv::OpTypePointer);
        return (StorageClass)idToInstruction[typeId]->getImmediateOperand(0);
    }